

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FieldMap.cpp
# Opt level: O2

string * __thiscall FIX::FieldMap::calculateString(FieldMap *this,string *result)

{
  const_iterator cVar1;
  _Base_ptr p_Var2;
  pointer this_00;
  int local_3c;
  Groups *local_38;
  
  local_38 = &this->m_groups;
  for (this_00 = (this->m_fields).
                 super__Vector_base<FIX::FieldBase,_std::allocator<FIX::FieldBase>_>._M_impl.
                 super__Vector_impl_data._M_start;
      this_00 !=
      (this->m_fields).super__Vector_base<FIX::FieldBase,_std::allocator<FIX::FieldBase>_>._M_impl.
      super__Vector_impl_data._M_finish; this_00 = this_00 + 1) {
    FieldBase::getFixString_abi_cxx11_(this_00);
    std::__cxx11::string::append((string *)result);
    if ((this->m_groups)._M_t._M_impl.super__Rb_tree_header._M_node_count != 0) {
      local_3c = this_00->m_tag;
      cVar1 = std::
              _Rb_tree<int,_std::pair<const_int,_std::vector<FIX::FieldMap_*,_std::allocator<FIX::FieldMap_*>_>_>,_std::_Select1st<std::pair<const_int,_std::vector<FIX::FieldMap_*,_std::allocator<FIX::FieldMap_*>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<FIX::FieldMap_*,_std::allocator<FIX::FieldMap_*>_>_>_>_>
              ::find(&local_38->_M_t,&local_3c);
      if ((_Rb_tree_header *)cVar1._M_node != &(this->m_groups)._M_t._M_impl.super__Rb_tree_header)
      {
        for (p_Var2 = cVar1._M_node[1]._M_parent; p_Var2 != cVar1._M_node[1]._M_left;
            p_Var2 = (_Base_ptr)&p_Var2->_M_parent) {
          calculateString(*(FieldMap **)p_Var2,result);
        }
      }
    }
  }
  return result;
}

Assistant:

std::string& FieldMap::calculateString( std::string& result ) const
{  
  Fields::const_iterator i;
  for ( i = m_fields.begin(); i != m_fields.end(); ++i )
  {
    result += i->getFixString();

    // add groups if they exist
    if( !m_groups.size() ) continue;
    Groups::const_iterator j = m_groups.find( i->getTag() );
    if ( j == m_groups.end() ) continue;
    std::vector < FieldMap* > ::const_iterator k;
    for ( k = j->second.begin(); k != j->second.end(); ++k )
      ( *k ) ->calculateString( result );
  }
  return result;
}